

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_loader.cpp
# Opt level: O3

Type __thiscall embree::SceneGraph::PlyParser::parseType(PlyParser *this,stringstream *cin)

{
  int iVar1;
  Tag TVar2;
  Tag TVar3;
  ulong uVar4;
  Type TVar5;
  string ty;
  string ty1;
  string ty0;
  string local_88;
  string local_68;
  string local_48;
  
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::operator>>((istream *)cin,(string *)&local_88);
  iVar1 = std::__cxx11::string::compare((char *)&local_88);
  if (iVar1 == 0) {
    local_48._M_string_length = 0;
    local_48.field_2._M_local_buf[0] = '\0';
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::operator>>((istream *)cin,(string *)&local_48);
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::operator>>((istream *)cin,(string *)&local_68);
    TVar2 = typeTagOfString(&local_48);
    TVar3 = typeTagOfString(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    uVar4 = (ulong)TVar2 << 0x20;
    TVar2 = PTY_LIST;
  }
  else {
    TVar2 = typeTagOfString(&local_88);
    uVar4 = 0x900000000;
    TVar3 = PTY_NONE;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  TVar5.data = TVar3;
  TVar5.ty = (int)(uVar4 | TVar2);
  TVar5.index = (int)((uVar4 | TVar2) >> 0x20);
  return TVar5;
}

Assistant:

Type parseType(std::stringstream& cin) 
      {
        std::string ty; cin >> ty;
        if (ty == "list") {
          std::string ty0; cin >> ty0;
          std::string ty1; cin >> ty1;
          return Type(Type::PTY_LIST,typeTagOfString(ty0),typeTagOfString(ty1));
        } else return Type(typeTagOfString(ty));
      }